

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_free(archive_write *a)

{
  void *__ptr;
  undefined8 *__ptr_00;
  long in_RDI;
  cd_segment *segment;
  zip_conflict *zip;
  
  __ptr = *(void **)(in_RDI + 0xd0);
  while (*(long *)((long)__ptr + 0x68) != 0) {
    __ptr_00 = *(undefined8 **)((long)__ptr + 0x68);
    *(undefined8 *)((long)__ptr + 0x68) = *__ptr_00;
    free((void *)__ptr_00[2]);
    free(__ptr_00);
  }
  free(*(void **)((long)__ptr + 0x128));
  archive_entry_free((archive_entry *)0x19ae2a);
  free(__ptr);
  *(undefined8 *)(in_RDI + 0xd0) = 0;
  return 0;
}

Assistant:

static int
archive_write_zip_free(struct archive_write *a)
{
	struct zip *zip;
	struct cd_segment *segment;

	zip = a->format_data;
	while (zip->central_directory != NULL) {
		segment = zip->central_directory;
		zip->central_directory = segment->next;
		free(segment->buff);
		free(segment);
	}
#ifdef HAVE_ZLIB_H
	free(zip->buf);
#endif
	archive_entry_free(zip->entry);
	/* TODO: Free opt_sconv, sconv_default */

	free(zip);
	a->format_data = NULL;
	return (ARCHIVE_OK);
}